

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jquant1.c
# Opt level: O0

void color_quantize3(j_decompress_ptr cinfo,JSAMPARRAY input_buf,JSAMPARRAY output_buf,int num_rows)

{
  byte bVar1;
  JDIMENSION JVar2;
  jpeg_color_quantizer *pjVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  byte *pbVar7;
  byte *pbVar8;
  JDIMENSION local_68;
  JDIMENSION width;
  JDIMENSION col;
  int row;
  JSAMPROW colorindex2;
  JSAMPROW colorindex1;
  JSAMPROW colorindex0;
  JSAMPROW ptrout;
  JSAMPROW ptrin;
  int pixcode;
  my_cquantize_ptr cquantize;
  int num_rows_local;
  JSAMPARRAY output_buf_local;
  JSAMPARRAY input_buf_local;
  j_decompress_ptr cinfo_local;
  
  pjVar3 = cinfo->cquantize;
  lVar4 = *(long *)pjVar3[1].finish_pass;
  lVar5 = *(long *)(pjVar3[1].finish_pass + 8);
  lVar6 = *(long *)(pjVar3[1].finish_pass + 0x10);
  JVar2 = cinfo->output_width;
  for (width = 0; (int)width < num_rows; width = width + 1) {
    ptrout = input_buf[(int)width];
    colorindex0 = output_buf[(int)width];
    for (local_68 = JVar2; local_68 != 0; local_68 = local_68 - 1) {
      pbVar7 = ptrout + 1;
      bVar1 = *ptrout;
      pbVar8 = ptrout + 2;
      ptrout = ptrout + 3;
      *colorindex0 = *(char *)(lVar6 + (int)(uint)*pbVar8) +
                     *(char *)(lVar5 + (int)(uint)*pbVar7) + *(char *)(lVar4 + (int)(uint)bVar1);
      colorindex0 = colorindex0 + 1;
    }
  }
  return;
}

Assistant:

METHODDEF(void)
color_quantize3 (j_decompress_ptr cinfo, JSAMPARRAY input_buf,
		 JSAMPARRAY output_buf, int num_rows)
/* Fast path for out_color_components==3, no dithering */
{
  my_cquantize_ptr cquantize = (my_cquantize_ptr) cinfo->cquantize;
  register int pixcode;
  register JSAMPROW ptrin, ptrout;
  JSAMPROW colorindex0 = cquantize->colorindex[0];
  JSAMPROW colorindex1 = cquantize->colorindex[1];
  JSAMPROW colorindex2 = cquantize->colorindex[2];
  int row;
  JDIMENSION col;
  JDIMENSION width = cinfo->output_width;

  for (row = 0; row < num_rows; row++) {
    ptrin = input_buf[row];
    ptrout = output_buf[row];
    for (col = width; col > 0; col--) {
      pixcode  = GETJSAMPLE(colorindex0[GETJSAMPLE(*ptrin++)]);
      pixcode += GETJSAMPLE(colorindex1[GETJSAMPLE(*ptrin++)]);
      pixcode += GETJSAMPLE(colorindex2[GETJSAMPLE(*ptrin++)]);
      *ptrout++ = (JSAMPLE) pixcode;
    }
  }
}